

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  RepeatedPtrFieldBase temp;
  undefined1 local_28 [16];
  Arena *local_18;
  
  local_18 = other->arena_;
  if (this->arena_ != local_18) {
    local_28._0_8_ = (void *)0x0;
    local_28._8_8_ = (LogMessageData *)0x0;
    if (this->current_size_ != 0) {
      MergeFrom<proto2_unittest::TestAllTypes>((RepeatedPtrFieldBase *)local_28,this);
    }
    CopyFrom<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
              (this,other);
    InternalSwap(other,(RepeatedPtrFieldBase *)local_28);
    if ((void *)local_28._0_8_ != (void *)0x0) {
      Destroy<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
                ((RepeatedPtrFieldBase *)local_28);
    }
    ~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_28);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x226,"!internal::CanUseInternalSwap(GetArena(), other->GetArena())");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_28);
}

Assistant:

inline Arena* GetArena() const { return arena_; }